

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::SourceLocationTable::FindImport
          (SourceLocationTable *this,Message *descriptor,string *name,int *line,int *column)

{
  pointer pcVar1;
  const_iterator cVar2;
  int iVar3;
  _Rb_tree_header *p_Var4;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_38 [16];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50 = (undefined1  [8])descriptor;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  cVar2 = std::
          _Rb_tree<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>,_std::less<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>
          ::find(&(this->import_location_map_)._M_t,(key_type *)local_50);
  p_Var4 = &(this->import_location_map_)._M_t._M_impl.super__Rb_tree_header;
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if ((_Rb_tree_header *)cVar2._M_node == p_Var4) {
    *line = -1;
    iVar3 = 0;
  }
  else {
    *line = *(int *)&cVar2._M_node[2]._M_parent;
    iVar3 = *(int *)((long)&cVar2._M_node[2]._M_parent + 4);
  }
  *column = iVar3;
  return (_Rb_tree_header *)cVar2._M_node != p_Var4;
}

Assistant:

bool SourceLocationTable::FindImport(const Message* descriptor,
                                     const std::string& name, int* line,
                                     int* column) const {
  const std::pair<int, int>* result =
      FindOrNull(import_location_map_, std::make_pair(descriptor, name));
  if (result == nullptr) {
    *line = -1;
    *column = 0;
    return false;
  } else {
    *line = result->first;
    *column = result->second;
    return true;
  }
}